

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O1

QDebug operator<<(QDebug dbg,QRhiSwapChainHdrInfo *info)

{
  undefined8 uVar1;
  int *in_RDX;
  QTextStream *pQVar2;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QDebugStateSaver saver;
  undefined1 *local_50;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_50,(QDebug *)info);
  pQVar2 = *(QTextStream **)info;
  pQVar2[0x30] = (QTextStream)0x0;
  QVar3.m_data = (storage_type *)0x15;
  QVar3.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar3);
  QTextStream::operator<<(pQVar2,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((*(QTextStream **)info)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)info,' ');
  }
  if (*in_RDX == 1) {
    pQVar2 = *(QTextStream **)info;
    pQVar2[0x30] = (QTextStream)0x0;
    QVar7.m_data = (storage_type *)0x18;
    QVar7.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar7);
    QTextStream::operator<<(pQVar2,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((*(QTextStream **)info)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)info,' ');
    }
    QTextStream::operator<<(*(QTextStream **)info,(float)in_RDX[1]);
    if ((*(QTextStream **)info)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)info,' ');
    }
    pQVar2 = *(QTextStream **)info;
    pQVar2[0x30] = (QTextStream)0x0;
    QVar8.m_data = (storage_type *)0x21;
    QVar8.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar8);
    QTextStream::operator<<(pQVar2,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((*(QTextStream **)info)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)info,' ');
    }
    QTextStream::operator<<(*(QTextStream **)info,(float)in_RDX[2]);
    pQVar2 = *(QTextStream **)info;
    if (pQVar2[0x30] == (QTextStream)0x1) {
LAB_00454dd6:
      QTextStream::operator<<(pQVar2,' ');
    }
  }
  else if (*in_RDX == 0) {
    pQVar2 = *(QTextStream **)info;
    pQVar2[0x30] = (QTextStream)0x0;
    QVar4.m_data = (storage_type *)0xe;
    QVar4.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar4);
    QTextStream::operator<<(pQVar2,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((*(QTextStream **)info)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)info,' ');
    }
    QTextStream::operator<<(*(QTextStream **)info,(float)in_RDX[1]);
    if ((*(QTextStream **)info)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)info,' ');
    }
    pQVar2 = *(QTextStream **)info;
    QVar5.m_data = (storage_type *)0xe;
    QVar5.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar5);
    QTextStream::operator<<(pQVar2,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((*(QTextStream **)info)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)info,' ');
    }
    QTextStream::operator<<(*(QTextStream **)info,(float)in_RDX[2]);
    pQVar2 = *(QTextStream **)info;
    if (pQVar2[0x30] != (QTextStream)0x0) goto LAB_00454dd6;
  }
  if (in_RDX[3] == 1) {
    pQVar2 = *(QTextStream **)info;
    pQVar2[0x30] = (QTextStream)0x0;
    QVar9.m_data = (storage_type *)0x11;
    QVar9.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar9);
    QTextStream::operator<<(pQVar2,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar2 = *(QTextStream **)info;
    if (pQVar2[0x30] != (QTextStream)0x1) goto LAB_00454e78;
  }
  else {
    if (in_RDX[3] != 0) goto LAB_00454e78;
    pQVar2 = *(QTextStream **)info;
    pQVar2[0x30] = (QTextStream)0x0;
    QVar6.m_data = (storage_type *)0x21;
    QVar6.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar6);
    QTextStream::operator<<(pQVar2,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((*(QTextStream **)info)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)info,' ');
    }
    QTextStream::operator<<(*(QTextStream **)info,(float)in_RDX[4]);
    pQVar2 = *(QTextStream **)info;
    if (pQVar2[0x30] == (QTextStream)0x0) goto LAB_00454e78;
  }
  QTextStream::operator<<(pQVar2,' ');
LAB_00454e78:
  pQVar2 = *(QTextStream **)info;
  pQVar2[0x30] = (QTextStream)0x0;
  QTextStream::operator<<(pQVar2,')');
  if ((*(QTextStream **)info)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)info,' ');
  }
  uVar1 = *(undefined8 *)info;
  *(undefined8 *)info = 0;
  *(undefined8 *)dbg.stream = uVar1;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (QDebug)dbg.stream;
}

Assistant:

QDebug operator<<(QDebug dbg, const QRhiSwapChainHdrInfo &info)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QRhiSwapChainHdrInfo(";
    switch (info.limitsType) {
    case QRhiSwapChainHdrInfo::LuminanceInNits:
        dbg.nospace() << " minLuminance=" << info.limits.luminanceInNits.minLuminance
                      << " maxLuminance=" << info.limits.luminanceInNits.maxLuminance;
        break;
    case QRhiSwapChainHdrInfo::ColorComponentValue:
        dbg.nospace() << " maxColorComponentValue=" << info.limits.colorComponentValue.maxColorComponentValue;
        dbg.nospace() << " maxPotentialColorComponentValue=" << info.limits.colorComponentValue.maxPotentialColorComponentValue;
        break;
    }
    switch (info.luminanceBehavior) {
    case QRhiSwapChainHdrInfo::SceneReferred:
        dbg.nospace() << " scene-referred, SDR white level=" << info.sdrWhiteLevel;
        break;
    case QRhiSwapChainHdrInfo::DisplayReferred:
        dbg.nospace() << " display-referred";
        break;
    }
    dbg.nospace() << ')';
    return dbg;
}